

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_cmdline.c
# Opt level: O0

ssize_t extract_quotation(archive_string *as,char *p)

{
  archive_string *as_00;
  long in_RSI;
  char *s;
  char in_stack_ffffffffffffffdf;
  long local_8;
  
  as_00 = (archive_string *)(in_RSI + 1);
  while (*(char *)&as_00->s != '\0') {
    if (*(char *)&as_00->s == '\\') {
      if (*(char *)((long)&as_00->s + 1) == '\0') {
        as_00 = (archive_string *)((long)&as_00->s + 1);
      }
      else {
        archive_strappend_char(as_00,in_stack_ffffffffffffffdf);
        as_00 = (archive_string *)((long)&as_00->s + 2);
      }
    }
    else {
      if (*(char *)&as_00->s == '\"') break;
      archive_strappend_char(as_00,in_stack_ffffffffffffffdf);
      as_00 = (archive_string *)((long)&as_00->s + 1);
    }
  }
  if (*(char *)&as_00->s == '\"') {
    local_8 = (long)as_00 + (1 - in_RSI);
  }
  else {
    local_8 = -0x19;
  }
  return local_8;
}

Assistant:

static ssize_t
extract_quotation(struct archive_string *as, const char *p)
{
	const char *s;

	for (s = p + 1; *s;) {
		if (*s == '\\') {
			if (s[1] != '\0') {
				archive_strappend_char(as, s[1]);
				s += 2;
			} else
				s++;
		} else if (*s == '"')
			break;
		else {
			archive_strappend_char(as, s[0]);
			s++;
		}
	}
	if (*s != '"')
		return (ARCHIVE_FAILED);/* Invalid sequence. */
	return ((ssize_t)(s + 1 - p));
}